

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison.h
# Opt level: O3

bool Compare<std::__cxx11::string_const&>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs,Comparison cmp
               )

{
  size_t sVar1;
  byte extraout_var;
  int iVar2;
  bool bVar3;
  
  bVar3 = true;
  switch(cmp) {
  case Less:
    std::__cxx11::string::compare((string *)lhs);
    bVar3 = (bool)(extraout_var >> 7);
    break;
  case LessOrEqual:
    iVar2 = std::__cxx11::string::compare((string *)lhs);
    bVar3 = iVar2 < 1;
    break;
  case Greater:
    iVar2 = std::__cxx11::string::compare((string *)lhs);
    bVar3 = 0 < iVar2;
    break;
  case GreaterOrEqual:
    iVar2 = std::__cxx11::string::compare((string *)lhs);
    bVar3 = -1 < iVar2;
    break;
  case Equal:
    sVar1 = lhs->_M_string_length;
    if (sVar1 == rhs->_M_string_length) {
      if (sVar1 == 0) {
        return true;
      }
      iVar2 = bcmp((lhs->_M_dataplus)._M_p,(rhs->_M_dataplus)._M_p,sVar1);
      return iVar2 == 0;
    }
    goto LAB_0010f309;
  case NotEqual:
    sVar1 = lhs->_M_string_length;
    if (sVar1 != rhs->_M_string_length) {
      return true;
    }
    if (sVar1 != 0) {
      iVar2 = bcmp((lhs->_M_dataplus)._M_p,(rhs->_M_dataplus)._M_p,sVar1);
      return iVar2 != 0;
    }
LAB_0010f309:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Compare(ValueType lhs, ValueType rhs, Comparison cmp) {
    switch (cmp) {
    case Comparison::Less:
        return lhs < rhs;
    case Comparison::LessOrEqual:
        return lhs <= rhs;
    case Comparison::Greater:
        return lhs > rhs;
    case Comparison::GreaterOrEqual:
        return lhs >= rhs;
    case Comparison::Equal:
        return lhs == rhs;
    case Comparison::NotEqual:
        return lhs != rhs;
    default:
        return true;
    }
}